

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

void __thiscall QRingBuffer::append(QRingBuffer *this,char *data,qint64 size)

{
  char *__dest;
  size_t in_RDX;
  char *in_RSI;
  char *writePointer;
  qint64 in_stack_00000068;
  
  if (in_RDX != 0) {
    __dest = reserve((QRingBuffer *)writePointer,in_stack_00000068);
    if (in_RDX == 1) {
      *__dest = *in_RSI;
    }
    else {
      memcpy(__dest,in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

void QRingBuffer::append(const char *data, qint64 size)
{
    Q_ASSERT(size >= 0);

    if (size == 0)
        return;

    char *writePointer = reserve(size);
    if (size == 1)
        *writePointer = *data;
    else
        ::memcpy(writePointer, data, size);
}